

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O0

void __thiscall
RandomNumberUtil_GetRandomBytes18_Test::RandomNumberUtil_GetRandomBytes18_Test
          (RandomNumberUtil_GetRandomBytes18_Test *this)

{
  RandomNumberUtil_GetRandomBytes18_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__RandomNumberUtil_GetRandomBytes18_Test_009eaac8;
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytes18) {
  int size = 18;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  std::vector<uint8_t> bytes2 = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
  EXPECT_EQ(bytes2.size(), static_cast<size_t>(size));
  EXPECT_STRNE(ByteData(bytes).GetHex().c_str(),
               ByteData(bytes2).GetHex().c_str());
}